

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O2

void deqp::gls::anon_unknown_1::genIndices
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *indices,int triangleCount)

{
  undefined8 in_RAX;
  short sVar1;
  int iVar2;
  bool bVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (indices,(long)(triangleCount * 3));
  iVar2 = 0;
  if (triangleCount < 1) {
    triangleCount = iVar2;
  }
  while (bVar3 = triangleCount != 0, triangleCount = triangleCount + -1, bVar3) {
    sVar1 = (short)iVar2;
    uStack_38 = CONCAT26(sVar1,(undefined6)uStack_38);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (indices,(unsigned_short *)((long)&uStack_38 + 6));
    uStack_38._0_6_ = CONCAT24(sVar1 + 1,(undefined4)uStack_38);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (indices,(unsigned_short *)((long)&uStack_38 + 4));
    uStack_38._0_4_ = CONCAT22(sVar1 + 2,(undefined2)uStack_38);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (indices,(unsigned_short *)((long)&uStack_38 + 2));
    iVar2 = iVar2 + 3;
  }
  return;
}

Assistant:

void genIndices (vector<GLushort>& indices, int triangleCount)
{
	indices.reserve(triangleCount*3);

	for (int triangleNdx = 0; triangleNdx < triangleCount; triangleNdx++)
	{
		indices.push_back((GLushort)(triangleNdx*3));
		indices.push_back((GLushort)(triangleNdx*3+1));
		indices.push_back((GLushort)(triangleNdx*3+2));
	}
}